

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTState * lj_ctype_init(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  CTState *__s;
  CType *pCVar3;
  size_t lenx;
  GCstr *pGVar4;
  CTypeID1 *pCVar5;
  CTypeID1 CVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  char *__s_00;
  
  lVar9 = 0;
  __s = (CTState *)lj_mem_realloc(L,(void *)0x0,0,0x1d0);
  pCVar3 = (CType *)lj_mem_realloc(L,(void *)0x0,0,0x800);
  memset(__s,0,0x1d0);
  __s->tab = pCVar3;
  __s->top = 0x60;
  __s->sizetab = 0x80;
  __s->L = (lua_State *)0x0;
  __s->g = (global_State *)(ulong)(L->glref).ptr32;
  __s_00 = "va_list";
  lVar8 = 0;
  do {
    uVar2 = *(uint *)((long)lj_ctype_typeinfo + lVar9);
    uVar1 = (int)(short)uVar2 >> 10;
    (&pCVar3->size)[lVar9] = uVar1;
    (&pCVar3->info)[lVar9] = uVar2 & 0xffff03ff;
    (&pCVar3->sib)[lVar9 * 2] = 0;
    uVar7 = uVar2 >> 0x1c;
    if ((uVar7 == 0xd) || (uVar7 == 7)) {
      lenx = strlen(__s_00);
      pGVar4 = lj_str_new(L,__s_00,lenx);
      pGVar4->marked = pGVar4->marked | 0x20;
      uVar2 = (uint)pGVar4;
      (&pCVar3->name)[lVar9].gcptr32 = uVar2;
      __s_00 = __s_00 + lenx + 1;
      uVar1 = uVar2 + 0xfb3ee249;
      uVar2 = (uVar2 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
      uVar2 = (uVar1 >> 0xd ^ uVar2) - (uVar2 >> 0x13) & 0x7f;
      pCVar5 = __s->hash + uVar2;
      CVar6 = __s->hash[uVar2];
LAB_0015c380:
      (&pCVar3->next)[lVar9 * 2] = CVar6;
      *pCVar5 = (CTypeID1)lVar8;
    }
    else {
      (&pCVar3->name)[lVar9].gcptr32 = 0;
      (&pCVar3->next)[lVar9 * 2] = 0;
      if (uVar7 != 5) {
        uVar2 = (uVar2 & 0xffff03ff ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
        pCVar5 = __s->hash + ((uVar1 >> 0xd ^ uVar2) - (uVar2 >> 0x13) & 0x7f);
        CVar6 = *pCVar5;
        goto LAB_0015c380;
      }
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 4;
    if (lVar8 == 0x60) {
      *(int *)((ulong)(L->glref).ptr32 + 0x194) = (int)__s;
      return __s;
    }
  } while( true );
}

Assistant:

CTState *lj_ctype_init(lua_State *L)
{
  CTState *cts = lj_mem_newt(L, sizeof(CTState), CTState);
  CType *ct = lj_mem_newvec(L, CTTYPETAB_MIN, CType);
  const char *name = lj_ctype_typenames;
  CTypeID id;
  memset(cts, 0, sizeof(CTState));
  cts->tab = ct;
  cts->sizetab = CTTYPETAB_MIN;
  cts->top = CTTYPEINFO_NUM;
  cts->L = NULL;
  cts->g = G(L);
  for (id = 0; id < CTTYPEINFO_NUM; id++, ct++) {
    CTInfo info = lj_ctype_typeinfo[id];
    ct->size = (CTSize)((int32_t)(info << 16) >> 26);
    ct->info = info & 0xffff03ffu;
    ct->sib = 0;
    if (ctype_type(info) == CT_KW || ctype_istypedef(info)) {
      size_t len = strlen(name);
      GCstr *str = lj_str_new(L, name, len);
      ctype_setname(ct, str);
      name += len+1;
      lj_ctype_addname(cts, ct, id);
    } else {
      setgcrefnull(ct->name);
      ct->next = 0;
      if (!ctype_isenum(info)) ctype_addtype(cts, ct, id);
    }
  }
  setmref(G(L)->ctype_state, cts);
  return cts;
}